

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-recv-in-a-row.c
# Opt level: O0

int run_test_udp_recv_in_a_row(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  size_t local_b0;
  int64_t eval_b_7;
  int64_t eval_a_7;
  size_t local_90;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int i;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_check_init(puVar2,&check_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x52,"uv_check_init(uv_default_loop(), &check_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_check_start(&check_handle,check_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x53,"uv_check_start(&check_handle, check_cb)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x55,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&server);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x57,"uv_udp_init(uv_default_loop(), &server)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x58,"uv_udp_bind(&server, (const struct sockaddr*) &addr, 0)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x59,"uv_udp_recv_start(&server, alloc_cb, sv_recv_cb)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x5b,"uv_udp_init(uv_default_loop(), &client)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar3 = uv_buf_init(send_data,10);
  eval_a_7 = (int64_t)uVar3.base;
  buf.base = (char *)eval_a_7;
  local_90 = uVar3.len;
  buf.len = local_90;
  for (eval_a._4_4_ = 0; eval_a._4_4_ < 4; eval_a._4_4_ = eval_a._4_4_ + 1) {
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&addr);
    if ((long)iVar1 != 10) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
              ,100,"sizeof(send_data)","==","r",10,"==",(long)iVar1);
      abort();
    }
  }
  uVar3 = uv_buf_init((char *)0x0,0);
  eval_a_8 = (int64_t)uVar3.base;
  buf.base = (char *)eval_a_8;
  local_b0 = uVar3.len;
  buf.len = local_b0;
  iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&addr);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x6d,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x73,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (check_cb_called == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x75,"check_cb_called");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x77,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_recv_in_a_row) {
  int i, r;
  
  ASSERT_OK(uv_check_init(uv_default_loop(), &check_handle));
  ASSERT_OK(uv_check_start(&check_handle, check_cb));

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &server));
  ASSERT_OK(uv_udp_bind(&server, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_udp_recv_start(&server, alloc_cb, sv_recv_cb));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &client));

  /* send N-1 udp packets */
  buf = uv_buf_init(send_data, sizeof(send_data));
  for (i = 0; i < N - 1; i ++) {
    r = uv_udp_try_send(&client,
                        &buf,
                        1,
                        (const struct sockaddr*) &addr);
    ASSERT_EQ(sizeof(send_data), r);
  }

  /* send an empty udp packet */
  buf = uv_buf_init(NULL, 0);
  r = uv_udp_try_send(&client,
                      &buf,
                      1,
                      (const struct sockaddr*) &addr);
  ASSERT_OK(r);

  /* check_cb() asserts that the N packets can be received
   * before it gets called. 
   */

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(check_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}